

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::LoadArena(Map *this)

{
  pointer *pppAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _List_node_base *p_Var3;
  World *pWVar4;
  iterator __position;
  Character *this_00;
  Map *pMVar5;
  long *******ppppppplVar6;
  long *******ppppppplVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  _List_node_base *p_Var11;
  long *plVar12;
  mapped_type *pmVar13;
  size_type *psVar14;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int subject;
  int subject_00;
  _List_node_base *p_Var15;
  _Node *__tmp;
  Arena *pAVar16;
  list<Character_*,_std::allocator<Character_*>_> *plVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> spawn;
  Arena_Spawn *s;
  string spawns_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  spawns;
  list<Character_*,_std::allocator<Character_*>_> update_characters;
  string local_128;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  Arena *local_e8;
  key_type local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  long *******local_a8;
  long *******local_a0;
  long local_98;
  key_type local_90;
  string local_70;
  string local_50;
  
  local_98 = 0;
  pAVar16 = this->arena;
  local_a8 = (long *******)&local_a8;
  local_a0 = (long *******)&local_a8;
  if (pAVar16 == (Arena *)0x0) goto LAB_0016de42;
  p_Var15 = (pAVar16->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  plVar17 = &pAVar16->map->characters;
  if (p_Var15 == (_List_node_base *)plVar17) {
LAB_0016de28:
    Arena::~Arena(pAVar16);
  }
  else {
    do {
      p_Var3 = p_Var15[1]._M_next;
      if ((Arena *)p_Var3[0x16]._M_next == this->arena) {
        p_Var11 = (_List_node_base *)operator_new(0x18);
        p_Var11[1]._M_next = p_Var3;
        std::__detail::_List_node_base::_M_hook(p_Var11);
        local_98 = local_98 + 1;
      }
      p_Var15 = p_Var15->_M_next;
    } while (p_Var15 != (_List_node_base *)plVar17);
    pAVar16 = this->arena;
    if (pAVar16 != (Arena *)0x0) goto LAB_0016de28;
    pAVar16 = (Arena *)0x0;
  }
  operator_delete(pAVar16,0x38);
  in_EDX = extraout_EDX;
LAB_0016de42:
  pWVar4 = this->world;
  util::to_string_abi_cxx11_(&local_128,(util *)(ulong)(uint)(int)this->id,in_EDX);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_128);
  psVar14 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_e0.field_2._M_allocated_capacity = *psVar14;
    local_e0.field_2._8_8_ = plVar12[3];
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar14;
    local_e0._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_e0._M_string_length = plVar12[1];
  *plVar12 = (long)psVar14;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  pmVar13 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar4->arenas_config,&local_e0);
  bVar8 = util::variant::GetBool(pmVar13);
  iVar9 = extraout_EDX_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    iVar9 = extraout_EDX_01;
  }
  paVar2 = &local_128.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    iVar9 = extraout_EDX_02;
  }
  if (bVar8) {
    pWVar4 = this->world;
    util::to_string_abi_cxx11_((string *)local_108,(util *)(ulong)(uint)(int)this->id,iVar9);
    plVar12 = (long *)std::__cxx11::string::append(local_108);
    psVar14 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_128.field_2._M_allocated_capacity = *psVar14;
      local_128.field_2._8_8_ = plVar12[3];
      local_128._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar14;
      local_128._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_128._M_string_length = plVar12[1];
    *plVar12 = (long)psVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pmVar13 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar4->arenas_config,&local_128);
    util::variant::GetString_abi_cxx11_(&local_e0,pmVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((Arena_Spawn *)local_108._0_8_ != (Arena_Spawn *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
    }
    util::explode(&local_c0,',',&local_e0);
    if (((int)local_c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
         (int)local_c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x60U) == 0) {
      local_e8 = (Arena *)operator_new(0x38);
      pWVar4 = this->world;
      util::to_string_abi_cxx11_((string *)local_108,(util *)(ulong)(uint)(int)this->id,subject);
      plVar12 = (long *)std::__cxx11::string::append(local_108);
      psVar14 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_128.field_2._M_allocated_capacity = *psVar14;
        local_128.field_2._8_8_ = plVar12[3];
        local_128._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar14;
        local_128._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_128._M_string_length = plVar12[1];
      *plVar12 = (long)psVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar4->arenas_config,&local_128);
      iVar9 = util::variant::GetInt(pmVar13);
      pWVar4 = this->world;
      util::to_string_abi_cxx11_(&local_70,(util *)(ulong)(uint)(int)this->id,subject_00);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_70);
      pAVar16 = local_e8;
      psVar14 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_90.field_2._M_allocated_capacity = *psVar14;
        local_90.field_2._8_8_ = plVar12[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar14;
        local_90._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_90._M_string_length = plVar12[1];
      *plVar12 = (long)psVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar4->arenas_config,&local_90);
      iVar10 = util::variant::GetInt(pmVar13);
      Arena::Arena(pAVar16,this,iVar9,iVar10);
      this->arena = pAVar16;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((Arena_Spawn *)local_108._0_8_ != (Arena_Spawn *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      this->arena->occupants = (int)local_98;
      local_108._0_8_ = (Arena_Spawn *)0x0;
      plVar12 = (long *)CONCAT44(local_c0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_c0.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      local_e8 = (Arena *)CONCAT44(local_c0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_c0.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
      if ((Arena *)plVar12 != local_e8) {
        iVar9 = 1;
        do {
          local_128._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,*plVar12,plVar12[1] + *plVar12);
          util::trim(&local_50,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          switch(iVar9 % 4) {
          case 0:
            iVar10 = util::to_int(&local_128);
            *(uchar *)(local_108._0_8_ + 3) = (uchar)iVar10;
            pAVar16 = this->arena;
            __position._M_current =
                 (pAVar16->spawns).super__Vector_base<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pAVar16->spawns).super__Vector_base<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Arena_Spawn*,std::allocator<Arena_Spawn*>>::
              _M_realloc_insert<Arena_Spawn*const&>
                        ((vector<Arena_Spawn*,std::allocator<Arena_Spawn*>> *)&pAVar16->spawns,
                         __position,(Arena_Spawn **)local_108);
            }
            else {
              *__position._M_current = (Arena_Spawn *)local_108._0_8_;
              pppAVar1 = &(pAVar16->spawns).
                          super__Vector_base<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppAVar1 = *pppAVar1 + 1;
            }
            local_108._0_8_ = (Arena_Spawn *)0x0;
            break;
          case 1:
            local_108._0_8_ = operator_new(4);
            iVar10 = util::to_int(&local_128);
            *(char *)local_108._0_8_ = (char)iVar10;
            break;
          case 2:
            iVar10 = util::to_int(&local_128);
            *(uchar *)(local_108._0_8_ + 1) = (uchar)iVar10;
            break;
          case 3:
            iVar10 = util::to_int(&local_128);
            *(uchar *)(local_108._0_8_ + 2) = (uchar)iVar10;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          plVar12 = plVar12 + 4;
          iVar9 = iVar9 + 1;
        } while ((Arena *)plVar12 != local_e8);
        if ((Arena_Spawn *)local_108._0_8_ != (Arena_Spawn *)0x0) {
          Console::Wrn("Invalid arena spawn string");
          operator_delete((void *)local_108._0_8_,4);
        }
      }
    }
    else {
      Console::Wrn("Invalid arena spawn data for map %i",(ulong)(uint)(int)this->id);
      this->arena = (Arena *)0x0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    ppppppplVar6 = local_a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      ppppppplVar6 = local_a8;
    }
  }
  else {
    this->arena = (Arena *)0x0;
    ppppppplVar6 = local_a8;
  }
  for (; ppppppplVar7 = local_a8, (long ********)ppppppplVar6 != &local_a8;
      ppppppplVar6 = (long *******)*ppppppplVar6) {
    this_00 = (Character *)ppppppplVar6[2];
    pAVar16 = this->arena;
    this_00->arena = pAVar16;
    if (pAVar16 == (Arena *)0x0) {
      pMVar5 = this_00->map;
      Character::Warp(this_00,pMVar5->id,pMVar5->relog_x,pMVar5->relog_y,WARP_ANIMATION_NONE);
    }
  }
  while ((long ********)ppppppplVar7 != &local_a8) {
    ppppppplVar6 = (long *******)*ppppppplVar7;
    operator_delete(ppppppplVar7,0x18);
    ppppppplVar7 = ppppppplVar6;
  }
  return;
}

Assistant:

void Map::LoadArena()
{
	std::list<Character *> update_characters;

	if (this->arena)
	{
		UTIL_FOREACH(this->arena->map->characters, character)
		{
			if (character->arena == this->arena)
			{
				update_characters.push_back(character);
			}
		}

		delete this->arena;
	}

	if (world->arenas_config[util::to_string(id) + ".enabled"])
	{
		std::string spawns_str = world->arenas_config[util::to_string(id) + ".spawns"];

		std::vector<std::string> spawns = util::explode(',', spawns_str);

		if (spawns.size() % 4 != 0)
		{
			Console::Wrn("Invalid arena spawn data for map %i", id);
			this->arena = 0;
		}
		else
		{
			this->arena = new Arena(this, static_cast<int>(world->arenas_config[util::to_string(id) + ".time"]), static_cast<int>(world->arenas_config[util::to_string(id) + ".block"]));
			this->arena->occupants = update_characters.size();

			int i = 1;
			Arena_Spawn *s = 0;
			UTIL_FOREACH(spawns, spawn)
			{
				util::trim(spawn);

				switch (i++ % 4)
				{
					case 1:
						s = new Arena_Spawn;
						s->sx = util::to_int(spawn);
						break;

					case 2:
						s->sy = util::to_int(spawn);
						break;

					case 3:
						s->dx = util::to_int(spawn);
						break;

					case 0:
						s->dy = util::to_int(spawn);
						this->arena->spawns.push_back(s);
						s = 0;
						break;
				}
			}

			if (s)
			{
				Console::Wrn("Invalid arena spawn string");
				delete s;
			}
		}
	}
	else
	{
		this->arena = 0;
	}

	UTIL_FOREACH(update_characters, character)
	{
		character->arena = this->arena;

		if (!this->arena)
		{
			character->Warp(character->map->id, character->map->relog_x, character->map->relog_y);
		}
	}
}